

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O0

ObjTypeSpecFldInfo *
ObjTypeSpecFldInfo::CreateFrom
          (uint id,PolymorphicInlineCache *cache,uint cacheId,EntryPointInfo *entryPoint,
          FunctionBody *topFunctionBody,FunctionBody *functionBody,
          FieldAccessStatsPtr inlineCacheStats)

{
  Type *jsType;
  code *pcVar1;
  TypeId TVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  uint16 uVar6;
  uint uVar7;
  LocalFunctionId LVar8;
  TypeId TVar9;
  PropertyId propertyId_00;
  BOOL BVar10;
  undefined4 *puVar11;
  DynamicObject *this;
  ScriptContext *this_00;
  Recycler *pRVar12;
  PropertyRecord *pPVar13;
  DynamicType *pDVar14;
  DynamicTypeHandler *pDVar15;
  FunctionInfo *this_01;
  Recycler *pRVar16;
  NativeEntryPointData *this_02;
  intptr_t iVar17;
  JITType *this_03;
  JITType **ppJVar18;
  EquivalentTypeSet *this_04;
  ObjTypeSpecFldInfo *this_05;
  char16 *pcVar19;
  JITTypeHolder JVar20;
  byte local_693;
  bool local_692;
  bool local_691;
  Type *local_660;
  FixedFieldInfo *local_640;
  bool local_635;
  byte local_611;
  bool local_609;
  ushort local_5f2;
  uint16 ti;
  PropertyRecord *propertyRecord_1;
  TrackAllocData local_5d8;
  ObjTypeSpecFldInfo *local_5b0;
  ObjTypeSpecFldInfo *info;
  undefined8 local_5a0;
  TrackAllocData local_598;
  code *local_570;
  undefined8 local_568;
  TrackAllocData local_560;
  DynamicType *local_538;
  DynamicType *dynamicType;
  code *pcStack_528;
  uint16 i_2;
  undefined8 local_520;
  TrackAllocData local_518;
  JITTypeHolderBase<Memory::Recycler> *local_4f0;
  RecyclerJITTypeHolder *types;
  undefined8 local_4e0;
  TrackAllocData local_4d8;
  JitTransferData *local_4b0;
  JitTransferData *jitTransferData;
  ObjTypeSpecPolymorphicInfo *pOStack_4a0;
  uint16 polymorphicInfoCount;
  ObjTypeSpecPolymorphicInfo *polymorphicInfoArray;
  EquivalentTypeSet *typeSet;
  bool doesntHaveEquivalence;
  PropertyGuard *pPStack_488;
  bool hasFixedValue;
  PropertyGuard *propertyGuard;
  code *pcStack_478;
  PropertyId propertyId;
  undefined8 local_470;
  TrackAllocData local_468;
  code *local_440;
  undefined8 local_438;
  TrackAllocData local_430;
  FixedFieldInfo *local_408;
  FixedFieldInfo *fixedFieldInfoArray;
  JavascriptFunction *fixedFunctionObject;
  InlineCache *inlineCache_1;
  Type local_3e8;
  uint16 i_1;
  uint16 typeNumber;
  ObjTypeSpecPolymorphicInfo localPolymorphicInfo [32];
  Type *localTypes [32];
  PropertyRecord *propertyRecord;
  Var fixedProperty;
  FixedFieldInfo localFixedFieldInfoArray [4];
  ushort local_ca;
  uint16 fixedFunctionCount;
  Recycler *recycler;
  ScriptContext *scriptContext;
  bool depolymorphize;
  InlineCache *inlineCache;
  uint16 i;
  uint16 typeCount;
  byte local_9c;
  bool areStressEquivalent;
  bool stress;
  bool isAccessorOnProto;
  bool isGetterAccessor;
  bool isAccessor;
  bool isProto;
  bool usesAuxSlot;
  bool canDepolymorphize;
  bool areEquivalent;
  uint16 slotIndex;
  uint16 firstNonEmptyCacheIndex;
  uint16 polyCacheSize;
  TypeId typeId;
  DynamicObject *accessorOwnerObject;
  DynamicObject *prototypeObject;
  InlineCache *inlineCaches;
  DynamicProfileInfo *pDStack_70;
  bool gatherDataForInlining;
  DynamicProfileInfo *profileData;
  FunctionBody *functionBody_local;
  FunctionBody *topFunctionBody_local;
  EntryPointInfo *entryPoint_local;
  PolymorphicInlineCache *pPStack_48;
  uint cacheId_local;
  PolymorphicInlineCache *cache_local;
  uint id_local;
  
  profileData = (DynamicProfileInfo *)functionBody;
  functionBody_local = topFunctionBody;
  topFunctionBody_local = (FunctionBody *)entryPoint;
  entryPoint_local._4_4_ = cacheId;
  pPStack_48 = cache;
  cache_local._4_4_ = id;
  bVar4 = Js::FunctionBody::HasDynamicProfileInfo(topFunctionBody);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x2d6,"(topFunctionBody->HasDynamicProfileInfo())",
                       "topFunctionBody->HasDynamicProfileInfo()");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pDStack_70 = Js::FunctionBody::GetAnyDynamicProfileInfo(functionBody_local);
  bVar4 = Js::PolymorphicInlineCache::GetCloneForJitTimeUse(pPStack_48);
  local_609 = false;
  if (bVar4) {
    local_609 = Js::FunctionBody::PolyInliningUsingFixedMethodsAllowedByConfigFlags
                          ((FunctionBody *)profileData,functionBody_local);
  }
  inlineCaches._7_1_ = local_609;
  uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody_local);
  LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody_local);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,EquivObjTypeSpecPhase,uVar7,LVar8);
  if (((bVar4) ||
      (bVar4 = Js::DynamicProfileInfo::IsEquivalentObjTypeSpecDisabled(pDStack_70), bVar4)) &&
     ((inlineCaches._7_1_ & 1) == 0)) {
    return (ObjTypeSpecFldInfo *)0x0;
  }
  uVar6 = Js::PolymorphicInlineCache::GetSize(pPStack_48);
  if (uVar6 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x2e3,"(cache->GetSize() < (65535))","cache->GetSize() < UINT16_MAX");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  prototypeObject = (DynamicObject *)Js::PolymorphicInlineCache::GetInlineCaches(pPStack_48);
  accessorOwnerObject = (DynamicObject *)0x0;
  _firstNonEmptyCacheIndex = (Type *)0x0;
  _canDepolymorphize = TypeIds_Limit;
  _isProto = Js::PolymorphicInlineCache::GetSize(pPStack_48);
  _isGetterAccessor = 0xffff;
  _stress = 0;
  areStressEquivalent = true;
  local_611 = 0;
  if (functionBody_local != (FunctionBody *)profileData) {
    uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody_local);
    LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody_local);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,DepolymorphizeInlineesPhase,uVar7,LVar8);
    local_611 = bVar4 ^ 0xff;
  }
  local_9c = local_611 & 1;
  typeCount._1_1_ = 0;
  typeCount._0_1_ = 0;
  i._1_1_ = 0;
  i._0_1_ = 0;
  inlineCache._7_1_ = 0;
  uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody_local);
  LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody_local);
  inlineCache._5_1_ =
       Js::Phases::IsEnabled((Phases *)&DAT_01ea7040,EquivObjTypeSpecPhase,uVar7,LVar8);
  inlineCache._2_2_ = 0;
  inlineCache._0_2_ = 0;
  inlineCache._6_1_ = inlineCache._5_1_;
  while( true ) {
    if ((((areStressEquivalent & 1U) != 0) || ((inlineCache._6_1_ & 1) != 0)) ||
       (((inlineCaches._7_1_ & 1) != 0 || (bVar4 = false, (local_9c & 1) != 0)))) {
      bVar4 = (ushort)inlineCache < _isProto;
    }
    if (!bVar4) break;
    this = prototypeObject + (ushort)inlineCache;
    bVar4 = Js::InlineCache::IsEmpty((InlineCache *)this);
    if (!bVar4) {
      if (_isGetterAccessor == 0xffff) {
        bVar4 = Js::InlineCache::IsLocal((InlineCache *)this);
        if (bVar4) {
          _canDepolymorphize =
               Js::Type::GetTypeId((Type *)((ulong)(((anon_union_24_3_61a6fa82_for_u *)
                                                    &this->super_RecyclableObject)->local).type &
                                           0xfffffffffffffffb));
          typeCount._1_1_ =
               ((ulong)(((anon_union_24_3_61a6fa82_for_u *)&this->super_RecyclableObject)->local).
                       type & 4) != 0;
          _stress = *(uint16 *)((long)&(this->auxSlots).ptr + 2);
          if (*(long *)((long)&this->super_RecyclableObject + 8) != 0) {
            areStressEquivalent = false;
            local_9c = 0;
          }
          inlineCaches._7_1_ = 0;
        }
        else {
          bVar4 = Js::InlineCache::IsProto((InlineCache *)this);
          if (bVar4) {
            if ((*(ushort *)&this->super_RecyclableObject >> 1 & 1) == 0) {
              typeCount._0_1_ = 1;
              _canDepolymorphize =
                   Js::Type::GetTypeId((Type *)(*(ulong *)((long)&this->super_RecyclableObject + 8)
                                               & 0xfffffffffffffffb));
              typeCount._1_1_ =
                   ((undefined1  [24])
                    *(anon_union_24_3_61a6fa82_for_u *)&this->super_RecyclableObject &
                   (undefined1  [24])0x4) != (undefined1  [24])0x0;
              _stress = *(uint16 *)((long)&this->super_RecyclableObject + 2);
              accessorOwnerObject = (DynamicObject *)(this->auxSlots).ptr;
            }
            else {
              areStressEquivalent = false;
              inlineCache._5_1_ = 0;
              local_9c = 0;
              inlineCaches._7_1_ = 0;
            }
          }
          else {
            bVar4 = Js::InlineCache::IsAccessor((InlineCache *)this);
            if (!bVar4) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                                 ,0x323,"(inlineCache.IsAccessor())","inlineCache.IsAccessor()");
              if (!bVar4) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 0;
            }
            uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)profileData);
            LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)profileData);
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FixAccessorPropsPhase,uVar7,LVar8)
            ;
            if (bVar4) {
              areStressEquivalent = false;
              inlineCache._5_1_ = 0;
            }
            else {
              i._1_1_ = 1;
              i._0_1_ = Js::InlineCache::IsGetterAccessor((InlineCache *)this);
              inlineCache._7_1_ =
                   (*(ushort *)((long)&this->super_RecyclableObject + 8) >> 3 & 1) != 0;
              _firstNonEmptyCacheIndex =
                   (((anon_union_24_3_61a6fa82_for_u *)&this->super_RecyclableObject)->local).type;
              _canDepolymorphize =
                   Js::Type::GetTypeId((Type *)((ulong)(this->auxSlots).ptr & 0xfffffffffffffffb));
              typeCount._1_1_ = ((ulong)(this->auxSlots).ptr & 4) != 0;
              _stress = *(uint16 *)((long)&this->super_RecyclableObject + 10);
            }
            inlineCaches._7_1_ = 0;
          }
        }
        if (((inlineCache._6_1_ & 1) == 0) || ((inlineCache._5_1_ & 1) != 0)) {
          _isGetterAccessor = (ushort)inlineCache;
        }
      }
      else {
        bVar4 = Js::InlineCache::IsLocal((InlineCache *)this);
        TVar2 = _canDepolymorphize;
        if (bVar4) {
          if ((_stress != *(uint16 *)((long)&(this->auxSlots).ptr + 2)) ||
             ((bool)(typeCount._1_1_ & 1) !=
              (((ulong)(((anon_union_24_3_61a6fa82_for_u *)&this->super_RecyclableObject)->local).
                       type & 4) != 0))) {
            areStressEquivalent = false;
          }
          if ((((((byte)typeCount & 1) != 0) || ((i._1_1_ & 1) != 0)) ||
              (*(long *)((long)&this->super_RecyclableObject + 8) != 0)) ||
             (TVar9 = Js::Type::GetTypeId((Type *)((ulong)(((anon_union_24_3_61a6fa82_for_u *)
                                                           &this->super_RecyclableObject)->local).
                                                          type & 0xfffffffffffffffb)),
             TVar2 != TVar9)) {
            areStressEquivalent = false;
            local_9c = 0;
          }
          inlineCaches._7_1_ = 0;
        }
        else {
          bVar4 = Js::InlineCache::IsProto((InlineCache *)this);
          TVar2 = _canDepolymorphize;
          if (bVar4) {
            if ((_stress != *(uint16 *)((long)&this->super_RecyclableObject + 2)) ||
               ((bool)(typeCount._1_1_ & 1) !=
                (((undefined1  [24])*(anon_union_24_3_61a6fa82_for_u *)&this->super_RecyclableObject
                 & (undefined1  [24])0x4) != (undefined1  [24])0x0))) {
              areStressEquivalent = false;
            }
            if (((((byte)typeCount & 1) == 0) || ((i._1_1_ & 1) != 0)) ||
               ((accessorOwnerObject != (DynamicObject *)(this->auxSlots).ptr ||
                (TVar9 = Js::Type::GetTypeId((Type *)(*(ulong *)((long)&this->super_RecyclableObject
                                                                + 8) & 0xfffffffffffffffb)),
                TVar2 != TVar9)))) {
              areStressEquivalent = false;
              local_9c = 0;
            }
          }
          else {
            if ((_stress != *(uint16 *)((long)&this->super_RecyclableObject + 10)) ||
               ((bool)(typeCount._1_1_ & 1) != (((ulong)(this->auxSlots).ptr & 4) != 0))) {
              areStressEquivalent = false;
            }
            if (((((i._1_1_ & 1) == 0) ||
                 (bVar4 = (bool)((byte)i & 1),
                 bVar5 = Js::InlineCache::IsGetterAccessor((InlineCache *)this),
                 TVar2 = _canDepolymorphize, bVar4 != bVar5)) || ((inlineCache._7_1_ & 1) == 0)) ||
               ((((*(ushort *)((long)&this->super_RecyclableObject + 8) >> 3 & 1) == 0 ||
                 (_firstNonEmptyCacheIndex !=
                  (((anon_union_24_3_61a6fa82_for_u *)&this->super_RecyclableObject)->local).type))
                || (TVar9 = Js::Type::GetTypeId((Type *)((ulong)(this->auxSlots).ptr &
                                                        0xfffffffffffffffb)), TVar2 != TVar9)))) {
              areStressEquivalent = false;
              local_9c = 0;
            }
            inlineCaches._7_1_ = 0;
          }
        }
      }
      inlineCache._2_2_ = inlineCache._2_2_ + 1;
    }
    inlineCache._0_2_ = (ushort)inlineCache + 1;
  }
  if (_isGetterAccessor == 0xffff) {
    if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
      inlineCacheStats->emptyPolyInlineCacheCount = inlineCacheStats->emptyPolyInlineCacheCount + 1;
    }
    return (ObjTypeSpecFldInfo *)0x0;
  }
  bVar4 = Js::PolymorphicInlineCache::GetIgnoreForEquivalentObjTypeSpec(pPStack_48);
  if (bVar4) {
    inlineCache._5_1_ = 0;
    areStressEquivalent = false;
  }
  local_635 = (inlineCaches._7_1_ & 1) != 0 && inlineCache._2_2_ < 5;
  inlineCaches._7_1_ = local_635;
  scriptContext._7_1_ = 0;
  if (((areStressEquivalent & 1U) == 0) && ((inlineCache._5_1_ & 1) == 0)) {
    if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
      inlineCacheStats->nonEquivPolyInlineCacheCount =
           inlineCacheStats->nonEquivPolyInlineCacheCount + 1;
    }
    Js::PolymorphicInlineCache::SetIgnoreForEquivalentObjTypeSpec(pPStack_48,true);
    scriptContext._7_1_ = local_9c & 1;
    if (((inlineCaches._7_1_ & 1) == 0) && (scriptContext._7_1_ == 0)) {
      return (ObjTypeSpecFldInfo *)0x0;
    }
  }
  if (_isProto <= _isGetterAccessor) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x38c,"(firstNonEmptyCacheIndex < polyCacheSize)",
                       "firstNonEmptyCacheIndex < polyCacheSize");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  if (_canDepolymorphize == TypeIds_Limit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x38d,"(typeId != Js::TypeIds_Limit)","typeId != Js::TypeIds_Limit");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  if (inlineCacheStats != (FieldAccessStatsPtr)0x0) {
    inlineCacheStats->equivPolyInlineCacheCount = inlineCacheStats->equivPolyInlineCacheCount + 1;
  }
  if (((inlineCache._6_1_ & 1) != 0) && ((areStressEquivalent & 1U) != (inlineCache._5_1_ & 1))) {
    _isProto = _isGetterAccessor + 1;
  }
  this_00 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)profileData);
  pRVar12 = Js::ScriptContext::GetRecycler(this_00);
  local_ca = 0;
  local_640 = (FixedFieldInfo *)&fixedProperty;
  do {
    FixedFieldInfo::FixedFieldInfo(local_640);
    local_640 = local_640 + 1;
  } while (local_640 != (FixedFieldInfo *)&localFixedFieldInfoArray[3].m_data.environmentAddr);
  propertyRecord = (PropertyRecord *)0x0;
  if (((((byte)typeCount & 1) != 0) || ((inlineCache._7_1_ & 1) != 0)) &&
     (((areStressEquivalent & 1U) != 0 || ((inlineCache._5_1_ & 1) != 0)))) {
    propertyId_00 =
         Js::FunctionBody::GetPropertyIdFromCacheId
                   ((FunctionBody *)profileData,entryPoint_local._4_4_);
    pPVar13 = Js::ScriptContext::GetPropertyName(this_00,propertyId_00);
    if (((byte)typeCount & 1) == 0) {
      if ((inlineCache._7_1_ & 1) != 0) {
        pDVar14 = Js::DynamicObject::GetDynamicType((DynamicObject *)_firstNonEmptyCacheIndex);
        pDVar15 = Js::DynamicType::GetTypeHandler(pDVar14);
        (*pDVar15->_vptr_DynamicTypeHandler[0x5b])
                  (pDVar15,pPVar13,&propertyRecord,4,(ulong)((byte)i & 1),this_00);
      }
    }
    else {
      pDVar14 = Js::DynamicObject::GetDynamicType(accessorOwnerObject);
      pDVar15 = Js::DynamicType::GetTypeHandler(pDVar14);
      (*pDVar15->_vptr_DynamicTypeHandler[0x5a])(pDVar15,pPVar13,&propertyRecord,3,this_00);
    }
    FixedFieldInfo::PopulateFixedField((Type *)0x0,propertyRecord,(FixedFieldInfo *)&fixedProperty);
  }
  local_660 = &local_3e8;
  do {
    ObjTypeSpecPolymorphicInfo::ObjTypeSpecPolymorphicInfo((ObjTypeSpecPolymorphicInfo *)local_660);
    local_660 = local_660 + 1;
  } while (local_660 != &localPolymorphicInfo[0x1e].m_data);
  inlineCache_1._6_2_ = 0;
  inlineCache_1._4_2_ = _isGetterAccessor;
  do {
    if (_isProto <= inlineCache_1._4_2_) {
      if ((((i._1_1_ & 1) != 0) && ((inlineCaches._7_1_ & 1) != 0)) && (1 < local_ca)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                           ,0x3fb,"(fixedFunctionCount <= 1)","fixedFunctionCount <= 1");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      if (((inlineCache._6_1_ & 1) != 0) && ((areStressEquivalent & 1U) != (inlineCache._5_1_ & 1)))
      {
        inlineCache._2_2_ = 1;
      }
      if (inlineCache_1._6_2_ != inlineCache._2_2_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                           ,0x403,"(typeNumber == typeCount)","typeNumber == typeCount");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      if ((inlineCaches._7_1_ & 1) == 0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_468,(type_info *)&FixedFieldInfo::typeinfo,0,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                   ,0x411);
        pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar12,&local_468);
        pcStack_478 = Memory::Recycler::AllocZero;
        local_470 = 0;
        local_408 = Memory::AllocateArray<Memory::Recycler,FixedFieldInfo,false>
                              ((Memory *)pRVar16,(Recycler *)Memory::Recycler::AllocZero,0,1);
        Memory::CopyArray<FixedFieldInfo,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                  (local_408,1,(FixedFieldInfo *)&fixedProperty,1);
      }
      else {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_430,(type_info *)&FixedFieldInfo::typeinfo,0,(ulong)local_ca,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                   ,0x40b);
        pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar12,&local_430);
        local_440 = Memory::Recycler::AllocZero;
        local_438 = 0;
        local_408 = Memory::AllocateArray<Memory::Recycler,FixedFieldInfo,false>
                              ((Memory *)pRVar16,(Recycler *)Memory::Recycler::AllocZero,0,
                               (ulong)local_ca);
        Memory::CopyArray<FixedFieldInfo,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                  (local_408,(ulong)local_ca,(FixedFieldInfo *)&fixedProperty,(ulong)local_ca);
      }
      propertyGuard._4_4_ =
           Js::FunctionBody::GetPropertyIdFromCacheId
                     ((FunctionBody *)profileData,entryPoint_local._4_4_);
      this_02 = Js::EntryPointInfo::GetNativeEntryPointData((EntryPointInfo *)topFunctionBody_local)
      ;
      pPStack_488 = NativeEntryPointData::RegisterSharedPropertyGuard
                              (this_02,propertyGuard._4_4_,this_00);
      local_691 = true;
      if ((inlineCaches._7_1_ & 1) == 0) {
        if (((((byte)typeCount & 1) != 0) || (local_692 = false, (inlineCache._7_1_ & 1) != 0)) &&
           (((areStressEquivalent & 1U) != 0 || (local_692 = false, (inlineCache._5_1_ & 1) != 0))))
        {
          iVar17 = FixedFieldInfo::GetFieldValue((FixedFieldInfo *)&fixedProperty);
          local_692 = iVar17 != 0;
        }
        local_691 = local_692;
      }
      typeSet._7_1_ = local_691;
      local_693 = 1;
      if ((areStressEquivalent & 1U) == 0) {
        local_693 = inlineCache._5_1_;
      }
      typeSet._6_1_ = (local_693 ^ 0xff) & 1;
      polymorphicInfoArray = (ObjTypeSpecPolymorphicInfo *)0x0;
      pOStack_4a0 = (ObjTypeSpecPolymorphicInfo *)0x0;
      jitTransferData._6_2_ = 0;
      local_4b0 = Js::EntryPointInfo::GetJitTransferData((EntryPointInfo *)topFunctionBody_local);
      if (local_4b0 == (JitTransferData *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                           ,0x423,"(jitTransferData != nullptr)","jitTransferData != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      if ((((areStressEquivalent & 1U) != 0) || ((inlineCache._5_1_ & 1) != 0)) ||
         (scriptContext._7_1_ != 0)) {
        if (scriptContext._7_1_ != 0) {
          SortTypesAndPolymorphicInfo
                    ((Type **)(localPolymorphicInfo + 0x1e),(ObjTypeSpecPolymorphicInfo *)&local_3e8
                     ,(uint16 *)((long)&inlineCache + 2));
          _stress = 0xffff;
          jitTransferData._6_2_ = inlineCache._2_2_;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_4d8,(type_info *)&ObjTypeSpecPolymorphicInfo::typeinfo,0,
                     (ulong)inlineCache._2_2_,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                     ,0x430);
          pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar12,&local_4d8);
          types = (RecyclerJITTypeHolder *)Memory::Recycler::AllocLeaf;
          local_4e0 = 0;
          pOStack_4a0 = Memory::AllocateArray<Memory::Recycler,ObjTypeSpecPolymorphicInfo,false>
                                  ((Memory *)pRVar16,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                   (ulong)inlineCache._2_2_);
        }
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_518,(type_info *)&JITTypeHolderBase<Memory::Recycler>::typeinfo,0,
                   (ulong)inlineCache._2_2_,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                   ,0x433);
        pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar12,&local_518);
        pcStack_528 = Memory::Recycler::Alloc;
        local_520 = 0;
        local_4f0 = Memory::
                    AllocateArray<Memory::Recycler,JITTypeHolderBase<Memory::Recycler>,false>
                              ((Memory *)pRVar16,(Recycler *)Memory::Recycler::Alloc,0,
                               (ulong)inlineCache._2_2_);
        for (dynamicType._6_2_ = 0; dynamicType._6_2_ < inlineCache._2_2_;
            dynamicType._6_2_ = dynamicType._6_2_ + 1) {
          JitTransferData::AddJitTimeTypeRef
                    (local_4b0,localTypes[(ulong)dynamicType._6_2_ - 1],pRVar12);
          if (((typeSet._7_1_ & 1) != 0) &&
             (bVar4 = Js::DynamicType::Is(localTypes[(ulong)dynamicType._6_2_ - 1]), bVar4)) {
            local_538 = (DynamicType *)localTypes[(ulong)dynamicType._6_2_ - 1];
            bVar4 = Js::DynamicType::GetIsLocked(local_538);
            if (!bVar4) {
              Js::DynamicType::LockType(local_538);
            }
          }
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_560,(type_info *)&JITType::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                     ,0x447);
          pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar12,&local_560);
          local_570 = Memory::Recycler::AllocInlined;
          local_568 = 0;
          this_03 = (JITType *)new<Memory::Recycler>(0x40,pRVar16,0x43c4b0);
          JITType::JITType(this_03);
          Memory::WriteBarrierPtr<JITType>::operator=(&local_4f0[dynamicType._6_2_].t,this_03);
          jsType = localTypes[(ulong)dynamicType._6_2_ - 1];
          ppJVar18 = Memory::WriteBarrierPtr::operator_cast_to_JITType__
                               ((WriteBarrierPtr *)(local_4f0 + dynamicType._6_2_));
          JITType::BuildFromJsType(jsType,*ppJVar18);
          if (scriptContext._7_1_ != 0) {
            pOStack_4a0[dynamicType._6_2_].m_data = (&local_3e8)[dynamicType._6_2_];
          }
        }
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_598,(type_info *)&Js::EquivalentTypeSet::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                   ,0x450);
        pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar12,&local_598);
        info = (ObjTypeSpecFldInfo *)Memory::Recycler::AllocInlined;
        local_5a0 = 0;
        this_04 = (EquivalentTypeSet *)new<Memory::Recycler>(0x10,pRVar16,0x43c4b0);
        Js::EquivalentTypeSet::EquivalentTypeSet(this_04,local_4f0,inlineCache._2_2_);
        polymorphicInfoArray = (ObjTypeSpecPolymorphicInfo *)this_04;
        if (scriptContext._7_1_ != 0) {
          Js::EquivalentTypeSet::SetSortedAndDuplicatesRemoved(this_04,true);
        }
      }
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_5d8,(type_info *)&typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                 ,0x45a);
      pRVar12 = Memory::Recycler::TrackAllocInfo(pRVar12,&local_5d8);
      this_05 = (ObjTypeSpecFldInfo *)new<Memory::Recycler>(0x50,pRVar12,0x43c4b0);
      ObjTypeSpecFldInfo(this_05,cache_local._4_4_,_canDepolymorphize,(JITType *)0x0,
                         (EquivalentTypeSet *)polymorphicInfoArray,(bool)(typeCount._1_1_ & 1),
                         (bool)((byte)typeCount & 1),(bool)(i._1_1_ & 1),(bool)(typeSet._7_1_ & 1),
                         (bool)(typeSet._7_1_ & 1),(bool)(typeSet._6_1_ & 1),true,_stress,
                         propertyGuard._4_4_,accessorOwnerObject,pPStack_488,
                         (JITTimeConstructorCache *)0x0,local_408,local_ca,jitTransferData._6_2_,
                         pOStack_4a0);
      local_5b0 = this_05;
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody_local);
      LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody_local);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar7,LVar8);
      if (!bVar4) {
        uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody_local);
        LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody_local);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar7,LVar8);
        if (!bVar4) {
          return local_5b0;
        }
      }
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody_local);
      LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody_local);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar7,LVar8);
      if (!bVar4) {
        uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody_local);
        LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody_local);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar7,LVar8);
        if (!bVar4) {
          return local_5b0;
        }
      }
      if (polymorphicInfoArray != (ObjTypeSpecPolymorphicInfo *)0x0) {
        pPVar13 = Js::ScriptContext::GetPropertyName(this_00,propertyGuard._4_4_);
        uVar3 = cache_local._4_4_;
        pcVar19 = Js::PropertyRecord::GetBuffer(pPVar13);
        Output::Print(L"Created ObjTypeSpecFldInfo: id %u, property %s(#%u), slot %u, type set: ",
                      (ulong)uVar3,pcVar19,(ulong)propertyGuard._4_4_,(ulong)_stress);
        for (local_5f2 = 0; (int)(uint)local_5f2 < (int)(inlineCache._2_2_ - 1);
            local_5f2 = local_5f2 + 1) {
          JVar20 = Js::EquivalentTypeSet::GetType
                             ((EquivalentTypeSet *)polymorphicInfoArray,local_5f2);
          Output::Print(L"0x%p, ",JVar20.t);
        }
        JVar20 = Js::EquivalentTypeSet::GetType
                           ((EquivalentTypeSet *)polymorphicInfoArray,inlineCache._2_2_ - 1);
        Output::Print(L"0x%p\n",JVar20.t);
        Output::Flush();
      }
      return local_5b0;
    }
    fixedFunctionObject = (JavascriptFunction *)(prototypeObject + inlineCache_1._4_2_);
    bVar4 = Js::InlineCache::IsEmpty((InlineCache *)fixedFunctionObject);
    if (!bVar4) {
      bVar4 = Js::InlineCache::IsLocal((InlineCache *)fixedFunctionObject);
      if (bVar4) {
        localTypes[(ulong)inlineCache_1._6_2_ - 1] =
             (Type *)((ulong)(fixedFunctionObject->super_DynamicObject).super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject & 0xfffffffffffffffb);
        if (scriptContext._7_1_ != 0) {
          ObjTypeSpecPolymorphicInfo::SetSlotIndex
                    ((ObjTypeSpecPolymorphicInfo *)(&local_3e8 + inlineCache_1._6_2_),
                     *(uint16 *)((long)&(fixedFunctionObject->super_DynamicObject).auxSlots.ptr + 2)
                    );
          ObjTypeSpecPolymorphicInfo::SetUsesAuxSlot
                    ((ObjTypeSpecPolymorphicInfo *)(&local_3e8 + inlineCache_1._6_2_),
                     ((ulong)(fixedFunctionObject->super_DynamicObject).super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject & 4) != 0);
        }
      }
      else {
        bVar4 = Js::InlineCache::IsProto((InlineCache *)fixedFunctionObject);
        if (bVar4) {
          localTypes[(ulong)inlineCache_1._6_2_ - 1] =
               (Type *)((ulong)(fixedFunctionObject->super_DynamicObject).super_RecyclableObject.
                               type.ptr & 0xfffffffffffffffb);
          if (scriptContext._7_1_ != 0) {
            ObjTypeSpecPolymorphicInfo::SetSlotIndex
                      ((ObjTypeSpecPolymorphicInfo *)(&local_3e8 + inlineCache_1._6_2_),
                       *(uint16 *)
                        ((long)&(fixedFunctionObject->super_DynamicObject).super_RecyclableObject.
                                super_FinalizableObject.super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject + 2));
            ObjTypeSpecPolymorphicInfo::SetUsesAuxSlot
                      ((ObjTypeSpecPolymorphicInfo *)(&local_3e8 + inlineCache_1._6_2_),
                       ((ulong)(fixedFunctionObject->super_DynamicObject).super_RecyclableObject.
                               type.ptr & 4) != 0);
          }
        }
        else {
          localTypes[(ulong)inlineCache_1._6_2_ - 1] =
               (Type *)((ulong)(fixedFunctionObject->super_DynamicObject).auxSlots.ptr &
                       0xfffffffffffffffb);
          if (scriptContext._7_1_ != 0) {
            ObjTypeSpecPolymorphicInfo::SetSlotIndex
                      ((ObjTypeSpecPolymorphicInfo *)(&local_3e8 + inlineCache_1._6_2_),
                       *(uint16 *)
                        ((long)&(fixedFunctionObject->super_DynamicObject).super_RecyclableObject.
                                type.ptr + 2));
            ObjTypeSpecPolymorphicInfo::SetUsesAuxSlot
                      ((ObjTypeSpecPolymorphicInfo *)(&local_3e8 + inlineCache_1._6_2_),
                       ((ulong)(fixedFunctionObject->super_DynamicObject).auxSlots.ptr & 4) != 0);
          }
        }
      }
      if ((inlineCaches._7_1_ & 1) == 0) {
LAB_00827a77:
        inlineCache_1._6_2_ = inlineCache_1._6_2_ + 1;
      }
      else {
        fixedFieldInfoArray = (FixedFieldInfo *)0x0;
        Js::InlineCache::TryGetFixedMethodFromCache
                  ((InlineCache *)fixedFunctionObject,(FunctionBody *)profileData,
                   entryPoint_local._4_4_,(JavascriptFunction **)&fixedFieldInfoArray);
        if (fixedFieldInfoArray != (FixedFieldInfo *)0x0) {
          this_01 = Js::JavascriptFunction::GetFunctionInfo
                              ((JavascriptFunction *)fixedFieldInfoArray);
          BVar10 = Js::FunctionInfo::HasBody(this_01);
          if (BVar10 != 0) {
            FixedFieldInfo::PopulateFixedField
                      (localTypes[(ulong)inlineCache_1._6_2_ - 1],fixedFieldInfoArray,
                       (FixedFieldInfo *)
                       &localFixedFieldInfoArray[(ulong)inlineCache_1._6_2_ - 1].m_data.
                        environmentAddr);
            local_ca = local_ca + 1;
            goto LAB_00827a77;
          }
        }
        if (((areStressEquivalent & 1U) == 0) && ((inlineCache._5_1_ & 1) == 0)) {
          return (ObjTypeSpecFldInfo *)0x0;
        }
        inlineCaches._7_1_ = 0;
        inlineCache_1._6_2_ = inlineCache_1._6_2_ + 1;
      }
    }
    inlineCache_1._4_2_ = inlineCache_1._4_2_ + 1;
  } while( true );
}

Assistant:

ObjTypeSpecFldInfo* ObjTypeSpecFldInfo::CreateFrom(uint id, Js::PolymorphicInlineCache* cache, uint cacheId,
    Js::EntryPointInfo *entryPoint, Js::FunctionBody* const topFunctionBody, Js::FunctionBody *const functionBody, Js::FieldAccessStatsPtr inlineCacheStats)
{

#ifdef FIELD_ACCESS_STATS
#define IncInlineCacheCount(counter) if (inlineCacheStats) { inlineCacheStats->counter++; }
#else
#define IncInlineCacheCount(counter)
#endif

    Assert(topFunctionBody->HasDynamicProfileInfo());
    auto profileData = topFunctionBody->GetAnyDynamicProfileInfo();

    bool gatherDataForInlining = cache->GetCloneForJitTimeUse() && functionBody->PolyInliningUsingFixedMethodsAllowedByConfigFlags(topFunctionBody);

    if (PHASE_OFF(Js::EquivObjTypeSpecPhase, topFunctionBody) || profileData->IsEquivalentObjTypeSpecDisabled())
    {
        if (!gatherDataForInlining)
        {
            return nullptr;
        }
    }

    Assert(cache->GetSize() < UINT16_MAX);
    Js::InlineCache* inlineCaches = cache->GetInlineCaches();
    Js::DynamicObject* prototypeObject = nullptr;
    Js::DynamicObject* accessorOwnerObject = nullptr;
    Js::TypeId typeId = Js::TypeIds_Limit;
    uint16 polyCacheSize = (uint16)cache->GetSize();
    uint16 firstNonEmptyCacheIndex = UINT16_MAX;
    uint16 slotIndex = 0;
    bool areEquivalent = true;
    bool canDepolymorphize = topFunctionBody != functionBody && !PHASE_OFF(Js::DepolymorphizeInlineesPhase, topFunctionBody);
    bool usesAuxSlot = false;
    bool isProto = false;
    bool isAccessor = false;
    bool isGetterAccessor = false;
    bool isAccessorOnProto = false;

    bool stress = PHASE_STRESS(Js::EquivObjTypeSpecPhase, topFunctionBody);
    bool areStressEquivalent = stress;

    uint16 typeCount = 0;
    for (uint16 i = 0; (areEquivalent || stress || gatherDataForInlining || canDepolymorphize) && i < polyCacheSize; i++)
    {
        Js::InlineCache& inlineCache = inlineCaches[i];
        if (inlineCache.IsEmpty()) continue;

        if (firstNonEmptyCacheIndex == UINT16_MAX)
        {
            if (inlineCache.IsLocal())
            {
                typeId = TypeWithoutAuxSlotTag(inlineCache.u.local.type)->GetTypeId();
                usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.local.type);
                slotIndex = inlineCache.u.local.slotIndex;
                // We don't support equivalent object type spec for adding properties.
                if (inlineCache.u.local.typeWithoutProperty != nullptr)
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
            // Missing properties cannot be treated as equivalent, because for objects with SDTH or DTH, we don't change the object's type
            // when we add a property.  We also don't invalidate proto inline caches (and guards) unless the property being added exists on the proto chain.
            // Missing properties by definition do not exist on the proto chain, so in the end we could have an EquivalentObjTypeSpec cache hit on a
            // property that once was missing, but has since been added. (See OS Bugs 280582).
            else if (inlineCache.IsProto())
            {
                if(!inlineCache.u.proto.isMissing)
                {
                    isProto = true;
                    typeId = TypeWithoutAuxSlotTag(inlineCache.u.proto.type)->GetTypeId();
                    usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.proto.type);
                    slotIndex = inlineCache.u.proto.slotIndex;
                    prototypeObject = inlineCache.u.proto.prototypeObject;
                }
                else
                {
                    areEquivalent = false;
                    areStressEquivalent = false;
                    canDepolymorphize = false;
                    gatherDataForInlining = false;
                }
            }
            else
            {
                AssertOrFailFast(inlineCache.IsAccessor());
                if (!PHASE_OFF(Js::FixAccessorPropsPhase, functionBody))
                {
                    isAccessor = true;
                    isGetterAccessor = inlineCache.IsGetterAccessor();
                    isAccessorOnProto = inlineCache.u.accessor.isOnProto;
                    accessorOwnerObject = inlineCache.u.accessor.object;
                    typeId = TypeWithoutAuxSlotTag(inlineCache.u.accessor.type)->GetTypeId();
                    usesAuxSlot = TypeHasAuxSlotTag(inlineCache.u.accessor.type);
                    slotIndex = inlineCache.u.accessor.slotIndex;
                }
                else
                {
                    areEquivalent = false;
                    areStressEquivalent = false;
                }
                gatherDataForInlining = false;
            }

            // If we're stressing equivalent object type spec then let's keep trying to find a cache that we could use.
            if (!stress || areStressEquivalent)
            {
                firstNonEmptyCacheIndex = i;
            }
        }
        else
        {
            if (inlineCache.IsLocal())
            {
                if (slotIndex != inlineCache.u.local.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.local.type))
                {
                    areEquivalent = false;
                }
                if (isProto || isAccessor || inlineCache.u.local.typeWithoutProperty != nullptr || typeId != TypeWithoutAuxSlotTag(inlineCache.u.local.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
            else if (inlineCache.IsProto())
            {
                if (slotIndex != inlineCache.u.proto.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.proto.type))
                {
                    areEquivalent = false;
                }
                if (!isProto || isAccessor || prototypeObject != inlineCache.u.proto.prototypeObject || typeId != TypeWithoutAuxSlotTag(inlineCache.u.proto.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
            }
            else
            {
                // Supporting equivalent obj type spec only for those polymorphic accessor property operations for which
                // 1. the property is on the same prototype, and
                // 2. the types are equivalent.
                //
                // This is done to keep the equivalence check helper as-is
                if (slotIndex != inlineCache.u.accessor.slotIndex || usesAuxSlot != TypeHasAuxSlotTag(inlineCache.u.accessor.type))
                {
                    areEquivalent = false;
                }
                if (!isAccessor || isGetterAccessor != inlineCache.IsGetterAccessor() || !isAccessorOnProto || !inlineCache.u.accessor.isOnProto ||
                    accessorOwnerObject != inlineCache.u.accessor.object || typeId != TypeWithoutAuxSlotTag(inlineCache.u.accessor.type)->GetTypeId())
                {
                    areEquivalent = false;
                    canDepolymorphize = false;
                }
                gatherDataForInlining = false;
            }
        }
        typeCount++;
    }

    if (firstNonEmptyCacheIndex == UINT16_MAX)
    {
        IncInlineCacheCount(emptyPolyInlineCacheCount);
        return nullptr;
    }

    if (cache->GetIgnoreForEquivalentObjTypeSpec())
    {
        areEquivalent = areStressEquivalent = false;
    }

#if ENABLE_FIXED_FIELDS
    gatherDataForInlining = gatherDataForInlining && (typeCount <= 4); // Only support 4-way (max) polymorphic inlining
#else
    gatherDataForInlining = false;
#endif

    bool depolymorphize = false;
    if (!areEquivalent && !areStressEquivalent)
    {
        IncInlineCacheCount(nonEquivPolyInlineCacheCount);
        cache->SetIgnoreForEquivalentObjTypeSpec(true);
        // Only do depolymorphication bookkeeping if we're in an inlinee and types are not equivalent
        depolymorphize = canDepolymorphize;
        if (!gatherDataForInlining && !depolymorphize)
        {
            return nullptr;
        }
    }

    Assert(firstNonEmptyCacheIndex < polyCacheSize);
    Assert(typeId != Js::TypeIds_Limit);
    IncInlineCacheCount(equivPolyInlineCacheCount);

    // If we're stressing equivalent object type spec and the types are not equivalent, let's grab the first one only.
    if (stress && (areEquivalent != areStressEquivalent))
    {
        polyCacheSize = firstNonEmptyCacheIndex + 1;
    }

    Js::ScriptContext* scriptContext = functionBody->GetScriptContext();
    Recycler* recycler = scriptContext->GetRecycler();

    uint16 fixedFunctionCount = 0;

    // Need to create a local array here and not allocate one from the recycler,
    // as the allocation may trigger a GC which can clear the inline caches.
    FixedFieldInfo localFixedFieldInfoArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

#if ENABLE_FIXED_FIELDS
    // For polymorphic field loads we only support fixed functions on prototypes. This helps keep the equivalence check helper simple.
    // Since all types in the polymorphic cache share the same prototype, it's enough to grab the fixed function from the prototype object.
    Js::Var fixedProperty = nullptr;
    if ((isProto || isAccessorOnProto) && (areEquivalent || areStressEquivalent))
    {
        const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(cacheId));
        if (isProto)
        {
            prototypeObject->GetDynamicType()->GetTypeHandler()->TryUseFixedProperty(propertyRecord, &fixedProperty, (Js::FixedPropertyKind)(Js::FixedPropertyKind::FixedMethodProperty | Js::FixedPropertyKind::FixedDataProperty), scriptContext);
        }
        else if (isAccessorOnProto)
        {
            accessorOwnerObject->GetDynamicType()->GetTypeHandler()->TryUseFixedAccessor(propertyRecord, &fixedProperty, Js::FixedPropertyKind::FixedAccessorProperty, isGetterAccessor, scriptContext);
        }

        FixedFieldInfo::PopulateFixedField(nullptr, fixedProperty, &localFixedFieldInfoArray[0]);

        // TODO (ObjTypeSpec): Enable constructor caches on equivalent polymorphic field loads with fixed functions.
    }
#endif
    // Let's get the types.
    Js::Type* localTypes[MaxPolymorphicInlineCacheSize];
    ObjTypeSpecPolymorphicInfo localPolymorphicInfo[MaxPolymorphicInlineCacheSize];

    uint16 typeNumber = 0;
    for (uint16 i = firstNonEmptyCacheIndex; i < polyCacheSize; i++)
    {
        Js::InlineCache& inlineCache = inlineCaches[i];
        if (inlineCache.IsEmpty()) continue;

        if (inlineCache.IsLocal())
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.local.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.local.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.local.type));
            }
        }
        else if (inlineCache.IsProto())
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.proto.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.proto.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.proto.type));
            }
        }
        else
        {
            localTypes[typeNumber] = TypeWithoutAuxSlotTag(inlineCache.u.accessor.type);
            if (depolymorphize)
            {
                localPolymorphicInfo[typeNumber].SetSlotIndex(inlineCache.u.accessor.slotIndex);
                localPolymorphicInfo[typeNumber].SetUsesAuxSlot(TypeHasAuxSlotTag(inlineCache.u.accessor.type));
            }
        }

#if ENABLE_FIXED_FIELDS
        if (gatherDataForInlining)
        {
            Js::JavascriptFunction* fixedFunctionObject = nullptr;
            inlineCache.TryGetFixedMethodFromCache(functionBody, cacheId, &fixedFunctionObject);
            if (!fixedFunctionObject || !fixedFunctionObject->GetFunctionInfo()->HasBody())
            {
                if (!(areEquivalent || areStressEquivalent))
                {
                    // If we reach here only because we are gathering data for inlining, and one of the Inline Caches doesn't have a fixedfunction object, return.
                    return nullptr;
                }
                else
                {
                    // If one of the inline caches doesn't have a fixed function object, abort gathering inlining data.
                    gatherDataForInlining = false;
                    typeNumber++;
                    continue;
                }
            }

            // We got a fixed function object from the cache.

            FixedFieldInfo::PopulateFixedField(localTypes[typeNumber], fixedFunctionObject, &localFixedFieldInfoArray[typeNumber]);

            fixedFunctionCount++;
        }
#endif
        typeNumber++;
    }

    if (isAccessor && gatherDataForInlining)
    {
        Assert(fixedFunctionCount <= 1);
    }

    if (stress && (areEquivalent != areStressEquivalent))
    {
        typeCount = 1;
    }

    AnalysisAssert(typeNumber == typeCount);

    // Now that we've copied all material info into local variables, we can start allocating without fear
    // that a garbage collection will clear any of the live inline caches.

    FixedFieldInfo* fixedFieldInfoArray;
    if (gatherDataForInlining)
    {
        fixedFieldInfoArray = RecyclerNewArrayZ(recycler, FixedFieldInfo, fixedFunctionCount);
        CopyArray<FixedFieldInfo, Field(Js::Var)>(
            fixedFieldInfoArray, fixedFunctionCount, localFixedFieldInfoArray, fixedFunctionCount);
    }
    else
    {
        fixedFieldInfoArray = RecyclerNewArrayZ(recycler, FixedFieldInfo, 1);
        CopyArray<FixedFieldInfo, Field(Js::Var)>(fixedFieldInfoArray, 1, localFixedFieldInfoArray, 1);
    }

    Js::PropertyId propertyId = functionBody->GetPropertyIdFromCacheId(cacheId);
    Js::PropertyGuard* propertyGuard = entryPoint->GetNativeEntryPointData()->RegisterSharedPropertyGuard(propertyId, scriptContext);

    // For polymorphic, non-equivalent objTypeSpecFldInfo's, hasFixedValue is true only if each of the inline caches has a fixed function for the given cacheId, or
    // in the case of an accessor cache, only if the there is only one version of the accessor.
    bool hasFixedValue = gatherDataForInlining ||
        ((isProto || isAccessorOnProto) && (areEquivalent || areStressEquivalent) && localFixedFieldInfoArray[0].GetFieldValue());

    bool doesntHaveEquivalence = !(areEquivalent || areStressEquivalent);

    Js::EquivalentTypeSet* typeSet = nullptr;
    ObjTypeSpecPolymorphicInfo * polymorphicInfoArray = nullptr;
    uint16 polymorphicInfoCount = 0;
    auto jitTransferData = entryPoint->GetJitTransferData();
    Assert(jitTransferData != nullptr);
    if (areEquivalent || areStressEquivalent || depolymorphize)
    {
        if (depolymorphize)
        {
            // Because we require the ordering of the polymorphic info to match the equivalent type set, and because there are places in the code
            // where the equivalent type set gets sorted without touching the polymorphic info, and may be more of them in future, just sort
            // them both now before anyone can use them.
            SortTypesAndPolymorphicInfo(localTypes, localPolymorphicInfo, &typeCount);

            // We don't have a single known slot index. We have one per type in the set. GlobOpt will sort out which one to use.
            slotIndex = Js::Constants::NoSlot;
            polymorphicInfoCount = typeCount;
            polymorphicInfoArray = RecyclerNewArrayLeaf(recycler, ObjTypeSpecPolymorphicInfo, typeCount);
        }

        RecyclerJITTypeHolder* types = RecyclerNewArray(recycler, RecyclerJITTypeHolder, typeCount);

        for (uint16 i = 0; i < typeCount; i++)
        {
            jitTransferData->AddJitTimeTypeRef(localTypes[i], recycler);
            if (hasFixedValue)
            {
                // Fixed field checks allow us to assume a specific type ID, but the assumption is only
                // valid if we lock the type. Otherwise, the type ID may change out from under us without
                // evolving the type.
                if (Js::DynamicType::Is(localTypes[i]))
                {
                    Js::DynamicType *dynamicType = static_cast<Js::DynamicType*>(localTypes[i]);
                    if (!dynamicType->GetIsLocked())
                    {
                        dynamicType->LockType();
                    }
                }
            }
            // TODO: OOP JIT, consider putting these inline
            types[i].t = RecyclerNew(recycler, JITType);
            __analysis_assume(localTypes[i] != nullptr);
            JITType::BuildFromJsType(localTypes[i], types[i].t);

            if (depolymorphize)
            {
                polymorphicInfoArray[i] = localPolymorphicInfo[i];
            }
        }
        typeSet = RecyclerNew(recycler, Js::EquivalentTypeSet, types, typeCount);
        if (depolymorphize)
        {
            // We sorted the set above.
            typeSet->SetSortedAndDuplicatesRemoved(true);
        }
    }

    ObjTypeSpecFldInfo* info = RecyclerNew(recycler, ObjTypeSpecFldInfo,
        id, typeId, nullptr, typeSet, usesAuxSlot, isProto, isAccessor, hasFixedValue, hasFixedValue, doesntHaveEquivalence, true, slotIndex, propertyId,
        prototypeObject, propertyGuard, nullptr, fixedFieldInfoArray, fixedFunctionCount, polymorphicInfoCount, polymorphicInfoArray);

    if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
    {
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, topFunctionBody) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, topFunctionBody))
        {
            if (typeSet)
            {
                const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propertyId);
                Output::Print(_u("Created ObjTypeSpecFldInfo: id %u, property %s(#%u), slot %u, type set: "),
                    id, propertyRecord->GetBuffer(), propertyId, slotIndex);
                for (uint16 ti = 0; ti < typeCount - 1; ti++)
                {
                    Output::Print(_u("0x%p, "), typeSet->GetType(ti));
                }
                Output::Print(_u("0x%p\n"), typeSet->GetType(typeCount - 1));
                Output::Flush();
            }
        }
    }

    return info;

#undef IncInlineCacheCount
}